

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O0

void Nwk_ManPrintLutSizes(Nwk_Man_t *p,If_LibLut_t *pLutLib)

{
  int iVar1;
  int iVar2;
  Nwk_Obj_t *p_00;
  uint local_428 [2];
  int Counters [256];
  int i;
  Nwk_Obj_t *pObj;
  If_LibLut_t *pLutLib_local;
  Nwk_Man_t *p_local;
  
  memset(local_428,0,0x400);
  for (Counters[0xff] = 0; iVar2 = Counters[0xff], iVar1 = Vec_PtrSize(p->vObjs), iVar2 < iVar1;
      Counters[0xff] = Counters[0xff] + 1) {
    p_00 = (Nwk_Obj_t *)Vec_PtrEntry(p->vObjs,Counters[0xff]);
    if ((p_00 != (Nwk_Obj_t *)0x0) && (iVar2 = Nwk_ObjIsNode(p_00), iVar2 != 0)) {
      iVar2 = Nwk_ObjFaninNum(p_00);
      Counters[(long)iVar2 + -2] = Counters[(long)iVar2 + -2] + 1;
    }
  }
  printf("LUTs by size: ");
  for (Counters[0xff] = 0; Counters[0xff] <= pLutLib->LutMax; Counters[0xff] = Counters[0xff] + 1) {
    printf("%d:%d ",(ulong)(uint)Counters[0xff],(ulong)(uint)Counters[(long)Counters[0xff] + -2]);
  }
  return;
}

Assistant:

void Nwk_ManPrintLutSizes( Nwk_Man_t * p, If_LibLut_t * pLutLib )
{
    Nwk_Obj_t * pObj;
    int i, Counters[256] = {0};
    Nwk_ManForEachNode( p, pObj, i )
        Counters[Nwk_ObjFaninNum(pObj)]++;
    printf( "LUTs by size: " );
    for ( i = 0; i <= pLutLib->LutMax; i++ )
        printf( "%d:%d ", i, Counters[i] );
}